

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O2

size_t __thiscall
BlockFilterIndex::WriteFilterToDisk(BlockFilterIndex *this,FlatFilePos *pos,BlockFilter *filter)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *t;
  long lVar1;
  string_view source_file;
  bool bVar2;
  size_t sVar3;
  Logger *pLVar4;
  FILE *pFVar5;
  int source_line;
  char *flag;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file_00;
  string_view source_file_01;
  string_view str;
  string_view logging_function_01;
  char *in_stack_fffffffffffffed0;
  char (*in_stack_fffffffffffffed8) [18];
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_118;
  bool out_of_space;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_f8 [5];
  string local_78;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (filter->m_filter_type != this->m_filter_type) {
    __assert_fail("filter.GetFilterType() == GetFilterType()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/blockfilterindex.cpp"
                  ,0xbf,
                  "size_t BlockFilterIndex::WriteFilterToDisk(FlatFilePos &, const BlockFilter &)");
  }
  t = &(filter->m_filter).m_encoded;
  sVar3 = GetSerializeSize<std::vector<unsigned_char,std::allocator<unsigned_char>>>(t);
  if (pos->nPos + sVar3 + 0x20 < 0x1000001) {
LAB_003db5d6:
    sVar3 = sVar3 + 0x20;
    FlatFileSeq::Allocate
              ((this->m_filter_fileseq)._M_t.
               super___uniq_ptr_impl<FlatFileSeq,_std::default_delete<FlatFileSeq>_>._M_t.
               super__Tuple_impl<0UL,_FlatFileSeq_*,_std::default_delete<FlatFileSeq>_>.
               super__Head_base<0UL,_FlatFileSeq_*,_false>._M_head_impl,pos,sVar3,&out_of_space);
    if (out_of_space != true) {
      pFVar5 = FlatFileSeq::Open((this->m_filter_fileseq)._M_t.
                                 super___uniq_ptr_impl<FlatFileSeq,_std::default_delete<FlatFileSeq>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_FlatFileSeq_*,_std::default_delete<FlatFileSeq>_>
                                 .super__Head_base<0UL,_FlatFileSeq_*,_false>._M_head_impl,pos,false
                                );
      log_msg._M_string_length = 0;
      log_msg.field_2._M_allocated_capacity = 0;
      log_msg.field_2._8_8_ = 0;
      local_118._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_118._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_118._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      log_msg._M_dataplus._M_p = (pointer)pFVar5;
      std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_118);
      if (pFVar5 == (FILE *)0x0) {
        logging_function._M_str = "WriteFilterToDisk";
        logging_function._M_len = 0x11;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/blockfilterindex.cpp"
        ;
        source_file_00._M_len = 99;
        LogPrintf_<char[18],int>
                  (logging_function,source_file_00,0xe3,
                   I2P|VALIDATION|QT|COINDB|LIBEVENT|RAND|CMPCTBLOCK|ADDRMAN|RPC|WALLETDB|HTTP|TOR,
                   (Level)pos,in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,
                   (int *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        sVar3 = 0;
      }
      else {
        base_blob<256U>::Serialize<AutoFile>
                  (&(filter->m_block_hash).super_base_blob<256U>,(AutoFile *)&log_msg);
        Serialize<AutoFile,unsigned_char,std::allocator<unsigned_char>>((AutoFile *)&log_msg,t);
      }
      AutoFile::~AutoFile((AutoFile *)&log_msg);
      goto LAB_003db7d4;
    }
    pLVar4 = LogInstance();
    bVar2 = BCLog::Logger::Enabled(pLVar4);
    if (bVar2) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_allocated_capacity =
           log_msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
      tinyformat::format<char[18]>
                (&local_78,"%s: out of disk space\n",(char (*) [18])"WriteFilterToDisk");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      pLVar4 = LogInstance();
      local_78._M_dataplus._M_p = (pointer)0x63;
      local_78._M_string_length = 0x6e31e1;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/blockfilterindex.cpp"
      ;
      source_file._M_len = 99;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function_01._M_str = "WriteFilterToDisk";
      logging_function_01._M_len = 0x11;
      BCLog::Logger::LogPrintStr(pLVar4,str,logging_function_01,source_file,0xdd,ALL,Info);
      std::__cxx11::string::~string((string *)&log_msg);
    }
  }
  else {
    log_msg._M_dataplus._M_p =
         (pointer)FlatFileSeq::Open((this->m_filter_fileseq)._M_t.
                                    super___uniq_ptr_impl<FlatFileSeq,_std::default_delete<FlatFileSeq>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_FlatFileSeq_*,_std::default_delete<FlatFileSeq>_>
                                    .super__Head_base<0UL,_FlatFileSeq_*,_false>._M_head_impl,pos,
                                    false);
    log_msg._M_string_length = 0;
    log_msg.field_2._M_allocated_capacity = 0;
    log_msg.field_2._8_8_ = 0;
    local_f8[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(local_f8);
    if (log_msg._M_dataplus._M_p == (pointer)0x0) {
      flag = "%s: Failed to open filter file %d\n";
      source_line = 0xc9;
    }
    else {
      bVar2 = TruncateFile((FILE *)log_msg._M_dataplus._M_p,pos->nPos);
      if (bVar2) {
        bVar2 = FileCommit((FILE *)log_msg._M_dataplus._M_p);
        if (bVar2) {
          pos->nFile = pos->nFile + 1;
          pos->nPos = 0;
          AutoFile::~AutoFile((AutoFile *)&log_msg);
          goto LAB_003db5d6;
        }
        flag = "%s: Failed to commit filter file %d\n";
        source_line = 0xd1;
      }
      else {
        flag = "%s: Failed to truncate filter file %d\n";
        source_line = 0xcd;
      }
    }
    logging_function_00._M_str = "WriteFilterToDisk";
    logging_function_00._M_len = 0x11;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/blockfilterindex.cpp"
    ;
    source_file_01._M_len = 99;
    LogPrintf_<char[18],int>
              (logging_function_00,source_file_01,source_line,(LogFlags)flag,(Level)pos,
               in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,
               (int *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    AutoFile::~AutoFile((AutoFile *)&log_msg);
  }
  sVar3 = 0;
LAB_003db7d4:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return sVar3;
  }
  __stack_chk_fail();
}

Assistant:

size_t BlockFilterIndex::WriteFilterToDisk(FlatFilePos& pos, const BlockFilter& filter)
{
    assert(filter.GetFilterType() == GetFilterType());

    size_t data_size =
        GetSerializeSize(filter.GetBlockHash()) +
        GetSerializeSize(filter.GetEncodedFilter());

    // If writing the filter would overflow the file, flush and move to the next one.
    if (pos.nPos + data_size > MAX_FLTR_FILE_SIZE) {
        AutoFile last_file{m_filter_fileseq->Open(pos)};
        if (last_file.IsNull()) {
            LogPrintf("%s: Failed to open filter file %d\n", __func__, pos.nFile);
            return 0;
        }
        if (!TruncateFile(last_file.Get(), pos.nPos)) {
            LogPrintf("%s: Failed to truncate filter file %d\n", __func__, pos.nFile);
            return 0;
        }
        if (!FileCommit(last_file.Get())) {
            LogPrintf("%s: Failed to commit filter file %d\n", __func__, pos.nFile);
            return 0;
        }

        pos.nFile++;
        pos.nPos = 0;
    }

    // Pre-allocate sufficient space for filter data.
    bool out_of_space;
    m_filter_fileseq->Allocate(pos, data_size, out_of_space);
    if (out_of_space) {
        LogPrintf("%s: out of disk space\n", __func__);
        return 0;
    }

    AutoFile fileout{m_filter_fileseq->Open(pos)};
    if (fileout.IsNull()) {
        LogPrintf("%s: Failed to open filter file %d\n", __func__, pos.nFile);
        return 0;
    }

    fileout << filter.GetBlockHash() << filter.GetEncodedFilter();
    return data_size;
}